

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

hts_itr_t *
hts_itr_querys(hts_idx_t *idx,char *reg,hts_name2id_f getid,void *hdr,hts_itr_query_func *itr_query,
              hts_readrec_func *readrec)

{
  long lVar1;
  hts_itr_query_func *phVar2;
  hts_readrec_func *phVar3;
  hts_idx_t *phVar4;
  int iVar5;
  char *pcVar6;
  hts_itr_t *phVar7;
  size_t __n;
  undefined8 uStack_60;
  char acStack_58 [8];
  hts_itr_query_func *local_50;
  hts_readrec_func *local_48;
  hts_idx_t *local_40;
  int local_38;
  int local_34;
  int beg;
  int end;
  
  if (*reg == '*') {
    if (reg[1] == '\0') {
      iVar5 = -2;
      goto LAB_001114cb;
    }
  }
  else if ((*reg == '.') && (reg[1] == '\0')) {
    iVar5 = -3;
LAB_001114cb:
    phVar7 = (*itr_query)(idx,iVar5,0,0,readrec);
    return phVar7;
  }
  uStack_60 = 0x111460;
  local_50 = itr_query;
  local_48 = readrec;
  local_40 = idx;
  pcVar6 = hts_parse_reg(reg,&local_38,&local_34);
  __n = (long)pcVar6 - (long)reg;
  lVar1 = -(__n + 0x10 & 0xfffffffffffffff0);
  pcVar6 = acStack_58 + lVar1;
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x111485;
  strncpy(pcVar6,reg,__n);
  pcVar6[__n] = '\0';
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x111493;
  iVar5 = (*getid)(hdr,pcVar6);
  if (iVar5 < 0) {
    *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1114a0;
    iVar5 = (*getid)(hdr,reg);
    if (iVar5 < 0) {
      return (hts_itr_t *)0x0;
    }
  }
  phVar4 = local_40;
  phVar3 = local_48;
  phVar2 = local_50;
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1114b7;
  phVar7 = (*phVar2)(phVar4,iVar5,local_38,local_34,phVar3);
  return phVar7;
}

Assistant:

hts_itr_t *hts_itr_querys(const hts_idx_t *idx, const char *reg, hts_name2id_f getid, void *hdr, hts_itr_query_func *itr_query, hts_readrec_func *readrec)
{
    int tid, beg, end;
    char *q, *tmp;
    if (strcmp(reg, ".") == 0)
        return itr_query(idx, HTS_IDX_START, 0, 0, readrec);
    else if (strcmp(reg, "*") != 0) {
        q = (char*)hts_parse_reg(reg, &beg, &end);
        tmp = (char*)alloca(q - reg + 1);
        strncpy(tmp, reg, q - reg);
        tmp[q - reg] = 0;
        if ((tid = getid(hdr, tmp)) < 0)
            tid = getid(hdr, reg);
        if (tid < 0) return 0;
        return itr_query(idx, tid, beg, end, readrec);
    } else return itr_query(idx, HTS_IDX_NOCOOR, 0, 0, readrec);
}